

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O0

H264_StorePic_t * alloc_storable_picture(H264dVideoCtx_t *p_Vid,RK_S32 structure)

{
  undefined8 in_R9;
  H264_StorePic_t *s;
  MPP_RET ret;
  RK_S32 structure_local;
  H264dVideoCtx_t *p_Vid_local;
  
  p_Vid_local = (H264dVideoCtx_t *)mpp_mem_pool_get_f("alloc_storable_picture",p_Vid->pic_st);
  if (p_Vid_local == (H264dVideoCtx_t *)0x0) {
    if ((h264d_debug & 1) != 0) {
      _mpp_log_l(4,"h264d_dpb","malloc buffer error(%d).\n",(char *)0x0,0x717,in_R9,0,0xfffffffc);
    }
    p_Vid_local = (H264dVideoCtx_t *)0x0;
  }
  else {
    *(undefined4 *)((long)p_Vid_local->spsSet + 0xac) = 0xffffffff;
    *(RK_S32 *)p_Vid_local->spsSet = structure;
  }
  return (H264_StorePic_t *)p_Vid_local;
}

Assistant:

H264_StorePic_t *alloc_storable_picture(H264dVideoCtx_t *p_Vid, RK_S32 structure)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_StorePic_t *s = mpp_mem_pool_get(p_Vid->pic_st);

    MEM_CHECK(ret, s);
    s->view_id = -1;
    s->structure = structure;
    (void)p_Vid;

    return s;
__FAILED:
    (void)ret;
    return NULL;
}